

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void filter_src_pixels_vertical_avx2
               (__m256i *horz_out,__m256i *src,__m256i *coeffs,__m256i *res_lo,__m256i *res_hi,
               int row)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 auVar6 [32];
  
  alVar1 = horz_out[(long)row + 3];
  auVar6 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])horz_out[(long)row + 4],0x21);
  alVar5 = (__m256i)vpunpcklwd_avx2((undefined1  [32])alVar1,auVar6);
  src[6] = alVar5;
  auVar2 = vpmaddwd_avx2((undefined1  [32])*src,(undefined1  [32])*coeffs);
  auVar3 = vpmaddwd_avx2((undefined1  [32])src[2],(undefined1  [32])coeffs[1]);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmaddwd_avx2((undefined1  [32])src[4],(undefined1  [32])coeffs[2]);
  auVar4 = vpmaddwd_avx2((undefined1  [32])alVar5,(undefined1  [32])coeffs[3]);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar2 = vpaddd_avx2(auVar2,auVar4);
  alVar1 = (__m256i)vpunpckhwd_avx2((undefined1  [32])alVar1,auVar6);
  src[7] = alVar1;
  auVar3 = vpmaddwd_avx2((undefined1  [32])src[1],(undefined1  [32])coeffs[4]);
  auVar4 = vpmaddwd_avx2((undefined1  [32])src[3],(undefined1  [32])coeffs[5]);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  auVar4 = vpmaddwd_avx2((undefined1  [32])src[5],(undefined1  [32])coeffs[6]);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmaddwd_avx2((undefined1  [32])alVar1,(undefined1  [32])coeffs[7]);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  alVar1 = (__m256i)vpunpckldq_avx2(auVar2,auVar3);
  *res_lo = alVar1;
  alVar1 = (__m256i)vpunpckhdq_avx2(auVar2,auVar3);
  *res_hi = alVar1;
  return;
}

Assistant:

static inline void filter_src_pixels_vertical_avx2(__m256i *horz_out,
                                                   __m256i *src,
                                                   __m256i *coeffs,
                                                   __m256i *res_lo,
                                                   __m256i *res_hi, int row) {
  const __m256i src_6 = horz_out[row + 3];
  const __m256i src_7 =
      _mm256_permute2x128_si256(horz_out[row + 3], horz_out[row + 4], 0x21);

  src[6] = _mm256_unpacklo_epi16(src_6, src_7);

  const __m256i res_0 = _mm256_madd_epi16(src[0], coeffs[0]);
  const __m256i res_2 = _mm256_madd_epi16(src[2], coeffs[1]);
  const __m256i res_4 = _mm256_madd_epi16(src[4], coeffs[2]);
  const __m256i res_6 = _mm256_madd_epi16(src[6], coeffs[3]);

  const __m256i res_even = _mm256_add_epi32(_mm256_add_epi32(res_0, res_2),
                                            _mm256_add_epi32(res_4, res_6));

  src[7] = _mm256_unpackhi_epi16(src_6, src_7);

  const __m256i res_1 = _mm256_madd_epi16(src[1], coeffs[4]);
  const __m256i res_3 = _mm256_madd_epi16(src[3], coeffs[5]);
  const __m256i res_5 = _mm256_madd_epi16(src[5], coeffs[6]);
  const __m256i res_7 = _mm256_madd_epi16(src[7], coeffs[7]);

  const __m256i res_odd = _mm256_add_epi32(_mm256_add_epi32(res_1, res_3),
                                           _mm256_add_epi32(res_5, res_7));

  // Rearrange pixels back into the order 0 ... 7
  *res_lo = _mm256_unpacklo_epi32(res_even, res_odd);
  *res_hi = _mm256_unpackhi_epi32(res_even, res_odd);
}